

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

void __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,_16>::runner
          (runner<ApprovalTests::cfg::reporter,_16> *this)

{
  memset(this,0,0x240);
  (this->reporter_).super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.colors_.none._M_len = 4
  ;
  (this->reporter_).super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.colors_.none._M_str =
       "\x1b[0m";
  (this->reporter_).super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.colors_.pass._M_len = 5
  ;
  (this->reporter_).super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.colors_.pass._M_str =
       "\x1b[32m";
  (this->reporter_).super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.colors_.fail._M_len = 5
  ;
  (this->reporter_).super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.colors_.fail._M_str =
       "\x1b[31m";
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &(this->reporter_).super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.out_);
  (this->reporter_).currentTest.sections.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->reporter_).currentTest.sections.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reporter_).currentTest.sections.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reporter_).currentTest.fileName._M_dataplus._M_p =
       (pointer)&(this->reporter_).currentTest.fileName.field_2;
  (this->reporter_).currentTest.fileName._M_string_length = 0;
  (this->reporter_).currentTest.fileName.field_2._M_local_buf[0] = '\0';
  (this->reporter_).currentTest.originalFileName._M_dataplus._M_p =
       (pointer)&(this->reporter_).currentTest.originalFileName.field_2;
  (this->reporter_).currentTest.originalFileName._M_string_length = 0;
  (this->reporter_).currentTest.originalFileName.field_2._M_local_buf[0] = '\0';
  (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->level_ = 0;
  this->run_ = false;
  memset(&this->fails_,0,0x108);
  filter::filter(&this->filter_,(string_view)ZEXT816(0));
  *(undefined8 *)
   ((long)&(this->tag_).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->tag_).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->tag_).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tag_).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

constexpr runner() = default;